

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O0

void __thiscall QStorageInfo::QStorageInfo(QStorageInfo *this,QString *path)

{
  QStorageInfoPrivate *this_00;
  QString *in_RDI;
  QStorageInfoPrivate *in_stack_ffffffffffffffc8;
  QStorageInfo *in_stack_ffffffffffffffe0;
  
  this_00 = (QStorageInfoPrivate *)operator_new(0xa0);
  QStorageInfoPrivate::QStorageInfoPrivate(this_00);
  QExplicitlySharedDataPointer<QStorageInfoPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)this_00,in_stack_ffffffffffffffc8)
  ;
  setPath(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

QStorageInfo::QStorageInfo(const QString &path)
    : d(new QStorageInfoPrivate)
{
    setPath(path);
}